

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddSourceMetadataToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  Utf8SourceInfo *object_00;
  bool bVar1;
  charcount_t value;
  ScriptContext *scriptContext;
  JsrtDebugPropertyId local_1c;
  Utf8SourceInfo *local_18;
  Utf8SourceInfo *utf8SourceInfo_local;
  DynamicObject *object_local;
  
  local_18 = utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)object;
  AddFileNameOrScriptTypeToObject(object,utf8SourceInfo);
  AddLineCountToObject((DynamicObject *)utf8SourceInfo_local,local_18);
  object_00 = utf8SourceInfo_local;
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_1c,sourceLength);
  value = Js::Utf8SourceInfo::GetCchLength(local_18);
  scriptContext = Js::Utf8SourceInfo::GetScriptContext(local_18);
  AddPropertyToObject((DynamicObject *)object_00,local_1c,value,scriptContext);
  bVar1 = Js::Utf8SourceInfo::HasDebugDocument(local_18);
  if (bVar1) {
    AddScriptIdToObject((DynamicObject *)utf8SourceInfo_local,local_18);
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddSourceMetadataToObject(Js::DynamicObject * object, Js::Utf8SourceInfo * utf8SourceInfo)
{
    JsrtDebugUtils::AddFileNameOrScriptTypeToObject(object, utf8SourceInfo);
    JsrtDebugUtils::AddLineCountToObject(object, utf8SourceInfo);
    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::sourceLength, utf8SourceInfo->GetCchLength(), utf8SourceInfo->GetScriptContext());

    if (utf8SourceInfo->HasDebugDocument())
    {
        // Only add the script ID in cases where a debug document exists
        JsrtDebugUtils::AddScriptIdToObject(object, utf8SourceInfo);
    }
}